

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

int __thiscall
CVmObjLookupTable::getp_get_def_val
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  vm_lookup_ext *pvVar2;
  undefined8 *in_RDX;
  CVmObjLookupTable *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  
  if ((getp_get_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_def_val::desc,0);
    __cxa_guard_release(&getp_get_def_val(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffffc8,(uint *)in_RDI,in_stack_ffffffffffffffb8);
  if (iVar1 == 0) {
    pvVar2 = get_ext(in_RDI);
    *in_RDX = *(undefined8 *)&pvVar2->default_value;
    *(anon_union_8_8_cb74652f_for_val *)(in_RDX + 1) = (pvVar2->default_value).val;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_get_def_val(VMG_ vm_obj_id_t self,
                                        vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* return the default value */
    *retval = get_ext()->default_value;
    return TRUE;
}